

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManCancelUntil(Cbs2_Man_t *p,int iBound)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = (p->pProp).iTail;
  if (iVar2 < iBound) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x228,"void Cbs2_ManCancelUntil(Cbs2_Man_t *, int)");
  }
  (p->pProp).iHead = iBound;
  for (lVar4 = (long)iBound; (lVar4 < iVar2 && (iVar2 = (p->pProp).pData[lVar4], iVar2 != 0));
      lVar4 = lVar4 + 1) {
    iVar2 = Abc_Lit2Var(iVar2);
    iVar3 = Cbs2_VarIsAssigned(p,iVar2);
    if (iVar3 == 0) {
      __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x85,"void Cbs2_VarUnassign(Cbs2_Man_t *, int)");
    }
    cVar1 = Vec_StrEntry(&p->vAssign,iVar2);
    Vec_StrWriteEntry(&p->vAssign,iVar2,cVar1 + '\x02');
    Vec_IntWriteEntry(&p->vLevReason,iVar2 * 3,-1);
    iVar2 = (p->pProp).iTail;
  }
  (p->pProp).iTail = iBound;
  return;
}

Assistant:

static inline void Cbs2_ManCancelUntil( Cbs2_Man_t * p, int iBound )
{
    int i, iLit;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
        Cbs2_VarUnassign( p, Abc_Lit2Var(iLit) );
    p->pProp.iTail = iBound;
}